

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lightsamplers.h
# Opt level: O0

Float __thiscall
pbrt::BVHLightSampler::EvaluateCost(BVHLightSampler *this,LightBounds *b,Bounds3f *bounds,int dim)

{
  float fVar1;
  float fVar2;
  Tuple3<pbrt::Vector3,_float> t;
  float *pfVar3;
  int in_ECX;
  long in_RSI;
  float fVar4;
  float fVar5;
  float fVar6;
  double dVar7;
  undefined1 auVar10 [56];
  undefined1 auVar8 [64];
  undefined1 extraout_var [56];
  undefined1 auVar9 [64];
  Vector3<float> VVar11;
  Float Kr;
  Float M_omega;
  Float sinTheta_o;
  Float theta_w;
  Float theta_e;
  Float theta_o;
  float fVar12;
  float in_stack_ffffffffffffff7c;
  float in_stack_ffffffffffffff80;
  float in_stack_ffffffffffffff84;
  float local_2c;
  float local_28;
  float local_24;
  float local_20;
  int local_1c;
  long local_10;
  
  local_1c = in_ECX;
  local_10 = in_RSI;
  dVar7 = std::acos((double)(ulong)*(uint *)(in_RSI + 0x28));
  local_20 = SUB84(dVar7,0);
  dVar7 = std::acos((double)(ulong)*(uint *)(local_10 + 0x2c));
  local_24 = SUB84(dVar7,0);
  local_2c = local_20 + local_24;
  pfVar3 = std::min<float>(&local_2c,(float *)&Pi);
  local_28 = *pfVar3;
  Sqr<float>(*(float *)(local_10 + 0x28));
  fVar4 = SafeSqrt(0.0);
  fVar12 = *(float *)(local_10 + 0x28);
  fVar1 = local_28 + local_28;
  dVar7 = std::cos((double)(ulong)(uint)(local_20 - fVar1));
  fVar2 = local_20 + local_20;
  fVar6 = *(float *)(local_10 + 0x28);
  auVar10 = (undefined1  [56])0x0;
  VVar11 = Bounds3<float>::Diagonal
                     ((Bounds3<float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  auVar8._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar8._8_56_ = auVar10;
  vmovlpd_avx(auVar8._0_16_);
  t.y = in_stack_ffffffffffffff80;
  t.x = in_stack_ffffffffffffff7c;
  t.z = in_stack_ffffffffffffff84;
  fVar5 = MaxComponentValue<pbrt::Vector3,float>(t);
  auVar10 = extraout_var;
  VVar11 = Bounds3<float>::Diagonal
                     ((Bounds3<float> *)
                      CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80));
  auVar9._0_8_ = VVar11.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar9._8_56_ = auVar10;
  vmovlpd_avx(auVar9._0_16_);
  pfVar3 = Tuple3<pbrt::Vector3,_float>::operator[]
                     ((Tuple3<pbrt::Vector3,_float> *)&stack0xffffffffffffff7c,local_1c);
  fVar12 = *(float *)(local_10 + 0x18) *
           ((1.0 - fVar12) * 6.2831855 +
           (((fVar1 * fVar4 - SUB84(dVar7,0)) - fVar2 * fVar4) + fVar6) * 1.5707964) *
           (fVar5 / *pfVar3);
  fVar6 = Bounds3<float>::SurfaceArea((Bounds3<float> *)CONCAT44(fVar12,fVar5));
  return fVar12 * fVar6;
}

Assistant:

Float EvaluateCost(const LightBounds &b, const Bounds3f &bounds, int dim) const {
        // Evaluate direction bounds measure for _LightBounds_
        Float theta_o = std::acos(b.cosTheta_o), theta_e = std::acos(b.cosTheta_e);
        Float theta_w = std::min(theta_o + theta_e, Pi);
        Float sinTheta_o = SafeSqrt(1 - Sqr(b.cosTheta_o));
        Float M_omega = 2 * Pi * (1 - b.cosTheta_o) +
                        Pi / 2 *
                            (2 * theta_w * sinTheta_o - std::cos(theta_o - 2 * theta_w) -
                             2 * theta_o * sinTheta_o + b.cosTheta_o);

        // Return complete cost estimate for _LightBounds_
        Float Kr = MaxComponentValue(bounds.Diagonal()) / bounds.Diagonal()[dim];
        return b.phi * M_omega * Kr * b.bounds.SurfaceArea();
    }